

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O0

ConstantMultiFieldModifier * __thiscall
icu_63::number::impl::MutablePatternModifier::createConstantModifier
          (MutablePatternModifier *this,UErrorCode *status)

{
  uint uVar1;
  int iVar2;
  CurrencySpacingEnabledModifier *this_00;
  ConstantMultiFieldModifier *this_01;
  NumberStringBuilder *sb;
  ConstantMultiFieldModifier *local_280;
  CurrencySpacingEnabledModifier *local_268;
  undefined1 local_220 [8];
  NumberStringBuilder b;
  NumberStringBuilder a;
  UErrorCode *status_local;
  MutablePatternModifier *this_local;
  
  NumberStringBuilder::NumberStringBuilder((NumberStringBuilder *)&b.fZero);
  NumberStringBuilder::NumberStringBuilder((NumberStringBuilder *)local_220);
  insertPrefix(this,(NumberStringBuilder *)&b.fZero,0,status);
  sb = (NumberStringBuilder *)local_220;
  insertSuffix(this,sb,0,status);
  uVar1 = (*this->fPatternInfo->_vptr_AffixPatternProvider[5])();
  if ((uVar1 & 1) == 0) {
    this_01 = (ConstantMultiFieldModifier *)UMemory::operator_new((UMemory *)0x220,(size_t)sb);
    local_280 = (ConstantMultiFieldModifier *)0x0;
    if (this_01 != (ConstantMultiFieldModifier *)0x0) {
      iVar2 = (*this->fPatternInfo->_vptr_AffixPatternProvider[10])();
      ConstantMultiFieldModifier::ConstantMultiFieldModifier
                (this_01,(NumberStringBuilder *)&b.fZero,(NumberStringBuilder *)local_220,
                 (bool)(~(byte)iVar2 & 1),(bool)(this->fStrong & 1));
      local_280 = this_01;
    }
    this_local = (MutablePatternModifier *)local_280;
  }
  else {
    this_00 = (CurrencySpacingEnabledModifier *)UMemory::operator_new((UMemory *)0x350,(size_t)sb);
    local_268 = (CurrencySpacingEnabledModifier *)0x0;
    if (this_00 != (CurrencySpacingEnabledModifier *)0x0) {
      iVar2 = (*this->fPatternInfo->_vptr_AffixPatternProvider[10])();
      CurrencySpacingEnabledModifier::CurrencySpacingEnabledModifier
                (this_00,(NumberStringBuilder *)&b.fZero,(NumberStringBuilder *)local_220,
                 (bool)(~(byte)iVar2 & 1),(bool)(this->fStrong & 1),this->fSymbols,status);
      local_268 = this_00;
    }
    this_local = (MutablePatternModifier *)local_268;
  }
  NumberStringBuilder::~NumberStringBuilder((NumberStringBuilder *)local_220);
  NumberStringBuilder::~NumberStringBuilder((NumberStringBuilder *)&b.fZero);
  return (ConstantMultiFieldModifier *)this_local;
}

Assistant:

ConstantMultiFieldModifier* MutablePatternModifier::createConstantModifier(UErrorCode& status) {
    NumberStringBuilder a;
    NumberStringBuilder b;
    insertPrefix(a, 0, status);
    insertSuffix(b, 0, status);
    if (fPatternInfo->hasCurrencySign()) {
        return new CurrencySpacingEnabledModifier(
                a, b, !fPatternInfo->hasBody(), fStrong, *fSymbols, status);
    } else {
        return new ConstantMultiFieldModifier(a, b, !fPatternInfo->hasBody(), fStrong);
    }
}